

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall stackjit::ExecutionEngine::loadRuntimeLibrary(ExecutionEngine *this)

{
  bool bVar1;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [39];
  undefined1 local_11;
  ExecutionEngine *pEStack_10;
  bool loaded;
  ExecutionEngine *this_local;
  
  if (((this->mVMState->config).loadRuntimeLibrary & 1U) != 0) {
    pEStack_10 = this;
    std::operator+(local_38,(char *)&this->mBaseDir);
    bVar1 = loadAssembly(this,local_38,Library);
    std::__cxx11::string::~string((string *)local_38);
    if (!bVar1) {
      local_11 = bVar1;
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Could not load the runtime library.");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void ExecutionEngine::loadRuntimeLibrary() {
		if (mVMState.config.loadRuntimeLibrary) {
			bool loaded = loadAssembly(mBaseDir + "rtlib/rtlib.simg");

			if (!loaded) {
				throw std::runtime_error("Could not load the runtime library.");
			}
		}
	}